

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_http.c
# Opt level: O2

void oonf_http_add(oonf_http_handler *handler)

{
  char *__s;
  size_t sVar1;
  
  __s = handler->site;
  sVar1 = strlen(__s);
  handler->directory = __s[sVar1 - 1] == '/';
  (handler->node).key = __s;
  avl_insert(&_http_site_tree,handler);
  if (((&log_global_mask)[_oonf_http_subsystem.logging] & 1) != 0) {
    oonf_log(1,(ulong)_oonf_http_subsystem.logging,"src/base/oonf_http.c",0xfb,0,0,
             "Added http handler for uri: %s",handler->site);
  }
  return;
}

Assistant:

void
oonf_http_add(struct oonf_http_handler *handler) {
  handler->directory = handler->site[strlen(handler->site) - 1] == '/';
  handler->node.key = handler->site;
  avl_insert(&_http_site_tree, &handler->node);

  OONF_DEBUG(LOG_HTTP, "Added http handler for uri: %s", handler->site);
}